

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)87>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<262u,Fixpp::Type::String>,Fixpp::TagT<55u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>> *this,
          Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_W_>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<262U,_Fixpp::Type::String>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  uint tag;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_5_local;
  bool param_4_local;
  TagSet<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_W_>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<262U,_Fixpp::Type::String>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>_>
  *tagSet_local;
  ParsingContext *context_local;
  Field *field_local;
  FieldParser<Fixpp::FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,context->cursor);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    bVar1 = StreamCursor::advance(cursor_00,1);
    if (bVar1) {
      FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>::set(field,(View *)local_70);
      tag = FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>::tag(field);
      TagSet<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<262U,_Fixpp::Type::String>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<262U,_Fixpp::Type::String>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
            ,tag);
    }
    else {
      ParsingContext::setError(context,Incomplete,"Expected value after tag \'%d\', got EOF",0x3c);
    }
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value tag \'%d\', got EOF",0x3c);
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }